

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::MatchSingleCharCaseInsensitive
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,Char c)

{
  MappingSource mappingSource_00;
  bool bVar1;
  Program *pPVar2;
  GroupInfo *pGVar3;
  GroupInfo *info_1;
  GroupInfo *info;
  uint local_28;
  MappingSource mappingSource;
  Char c_local;
  CharCount offset_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *this_local;
  
  pPVar2 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  mappingSource_00 = Program::GetCaseMappingSource(pPVar2);
  pPVar2 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  local_28 = offset;
  if ((pPVar2->flags & StickyRegexFlag) == NoRegexFlags) {
    for (; local_28 < inputLength; local_28 = local_28 + 1) {
      CompStats(this);
      bVar1 = MatchSingleCharCaseInsensitiveHere(this,mappingSource_00,input,local_28,c);
      if (bVar1) {
        pGVar3 = GroupIdToGroupInfo(this,0);
        pGVar3->offset = local_28;
        pGVar3->length = 1;
        return true;
      }
    }
    ResetGroup(this,0);
    this_local._7_1_ = false;
  }
  else {
    CompStats(this);
    bVar1 = MatchSingleCharCaseInsensitiveHere(this,mappingSource_00,input,offset,c);
    if (bVar1) {
      pGVar3 = GroupIdToGroupInfo(this,0);
      pGVar3->offset = offset;
      pGVar3->length = 1;
      this_local._7_1_ = true;
    }
    else {
      ResetGroup(this,0);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Matcher::MatchSingleCharCaseInsensitive(const Char* const input, const CharCount inputLength, CharCount offset, const Char c)
    {
        CaseInsensitive::MappingSource mappingSource = program->GetCaseMappingSource();

        // If sticky flag is present, break since the 1st character didn't match the pattern character
        if ((program->flags & StickyRegexFlag) != 0)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            else
            {
                ResetGroup(0);
                return false;
            }
        }

        while (offset < inputLength)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            offset++;
        }

        ResetGroup(0);
        return false;
    }